

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_mkstemp(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  undefined8 uVar4;
  char *pcVar5;
  uv_buf_t uVar6;
  char path_template [17];
  uv_fs_t req;
  
  builtin_strncpy(path_template,"test_file_XXXXXX",0x11);
  loop = uv_default_loop();
  iVar1 = uv_fs_mkstemp(loop,&mkstemp_req1,path_template,mkstemp_cb);
  if (iVar1 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkstemp_cb_count == 1) {
      iVar1 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req2,path_template,(uv_fs_cb)0x0);
      if (iVar1 < 0) {
        pcVar5 = "r >= 0";
        uVar4 = 0x4f0;
      }
      else {
        check_mkstemp_result(&mkstemp_req2);
        iVar1 = strcmp(mkstemp_req1.path,mkstemp_req2.path);
        if (iVar1 == 0) {
          pcVar5 = "strcmp(mkstemp_req1.path, mkstemp_req2.path) != 0";
          uVar4 = 0x4f4;
        }
        else {
          iVar1 = uv_fs_mkstemp((uv_loop_t *)0x0,&mkstemp_req3,"test_file",(uv_fs_cb)0x0);
          if (iVar1 == -0x16) {
            iov = uv_buf_init(test_buf,0xd);
            iVar1 = uv_fs_write((uv_loop_t *)0x0,&req,(uv_file)mkstemp_req1.result,&iov,1,-1,
                                (uv_fs_cb)0x0);
            if (iVar1 == 0xd) {
              if (req.result == 0xd) {
                uv_fs_req_cleanup(&req);
                uv_fs_close((uv_loop_t *)0x0,&req,(uv_file)mkstemp_req1.result,(uv_fs_cb)0x0);
                uv_fs_req_cleanup(&req);
                uv_fs_close((uv_loop_t *)0x0,&req,(uv_file)mkstemp_req2.result,(uv_fs_cb)0x0);
                uv_fs_req_cleanup(&req);
                iVar1 = uv_fs_open((uv_loop_t *)0x0,&req,mkstemp_req1.path,0,0,(uv_fs_cb)0x0);
                if (iVar1 < 0) {
                  pcVar5 = "fd >= 0";
                  uVar4 = 0x507;
                }
                else {
                  uv_fs_req_cleanup(&req);
                  buf[0x10] = '\0';
                  buf[0x11] = '\0';
                  buf[0x12] = '\0';
                  buf[0x13] = '\0';
                  buf[0x14] = '\0';
                  buf[0x15] = '\0';
                  buf[0x16] = '\0';
                  buf[0x17] = '\0';
                  buf[0x18] = '\0';
                  buf[0x19] = '\0';
                  buf[0x1a] = '\0';
                  buf[0x1b] = '\0';
                  buf[0x1c] = '\0';
                  buf[0x1d] = '\0';
                  buf[0x1e] = '\0';
                  buf[0x1f] = '\0';
                  buf[0] = '\0';
                  buf[1] = '\0';
                  buf[2] = '\0';
                  buf[3] = '\0';
                  buf[4] = '\0';
                  buf[5] = '\0';
                  buf[6] = '\0';
                  buf[7] = '\0';
                  buf[8] = '\0';
                  buf[9] = '\0';
                  buf[10] = '\0';
                  buf[0xb] = '\0';
                  buf[0xc] = '\0';
                  buf[0xd] = '\0';
                  buf[0xe] = '\0';
                  buf[0xf] = '\0';
                  uVar6 = uv_buf_init(buf,0x20);
                  iov = uVar6;
                  iVar2 = uv_fs_read((uv_loop_t *)0x0,&req,iVar1,&iov,1,-1,(uv_fs_cb)0x0);
                  if (iVar2 < 0) {
                    pcVar5 = "r >= 0";
                    uVar4 = 0x50d;
                  }
                  else if (req.result < 0) {
                    pcVar5 = "req.result >= 0";
                    uVar4 = 0x50e;
                  }
                  else {
                    iVar2 = strcmp(buf,test_buf);
                    if (iVar2 == 0) {
                      uv_fs_req_cleanup(&req);
                      uv_fs_close((uv_loop_t *)0x0,&req,iVar1,(uv_fs_cb)0x0);
                      uv_fs_req_cleanup(&req);
                      unlink(mkstemp_req1.path);
                      unlink(mkstemp_req2.path);
                      uv_fs_req_cleanup(&mkstemp_req1);
                      uv_fs_req_cleanup(&mkstemp_req2);
                      puVar3 = uv_default_loop();
                      close_loop(puVar3);
                      puVar3 = uv_default_loop();
                      iVar1 = uv_loop_close(puVar3);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar5 = "0 == uv_loop_close(uv_default_loop())";
                      uVar4 = 0x51a;
                    }
                    else {
                      pcVar5 = "strcmp(buf, test_buf) == 0";
                      uVar4 = 0x50f;
                    }
                  }
                }
              }
              else {
                pcVar5 = "req.result == sizeof(test_buf)";
                uVar4 = 0x4fd;
              }
            }
            else {
              pcVar5 = "r == sizeof(test_buf)";
              uVar4 = 0x4fc;
            }
          }
          else {
            pcVar5 = "uv_fs_mkstemp(NULL, &mkstemp_req3, \"test_file\", NULL) == UV_EINVAL";
            uVar4 = 0x4f7;
          }
        }
      }
    }
    else {
      pcVar5 = "mkstemp_cb_count == 1";
      uVar4 = 0x4ec;
    }
  }
  else {
    pcVar5 = "r == 0";
    uVar4 = 0x4e9;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(fs_mkstemp) {
  int r;
  int fd;
  const char path_template[] = "test_file_XXXXXX";
  uv_fs_t req;

  loop = uv_default_loop();

  r = uv_fs_mkstemp(loop, &mkstemp_req1, path_template, mkstemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkstemp_cb_count == 1);

  /* sync mkstemp */
  r = uv_fs_mkstemp(NULL, &mkstemp_req2, path_template, NULL);
  ASSERT(r >= 0);
  check_mkstemp_result(&mkstemp_req2);

  /* mkstemp return different values on subsequent calls */
  ASSERT(strcmp(mkstemp_req1.path, mkstemp_req2.path) != 0);

  /* invalid template returns EINVAL */
  ASSERT(uv_fs_mkstemp(NULL, &mkstemp_req3, "test_file", NULL) == UV_EINVAL);

  /* We can write to the opened file */
  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, mkstemp_req1.result, &iov, 1, -1, NULL);
  ASSERT(r == sizeof(test_buf));
  ASSERT(req.result == sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Cleanup */
  uv_fs_close(NULL, &req, mkstemp_req1.result, NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_close(NULL, &req, mkstemp_req2.result, NULL);
  uv_fs_req_cleanup(&req);

  fd = uv_fs_open(NULL, &req, mkstemp_req1.path , O_RDONLY, 0, NULL);
  ASSERT(fd >= 0);
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, fd, &iov, 1, -1, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  ASSERT(strcmp(buf, test_buf) == 0);
  uv_fs_req_cleanup(&req);

  uv_fs_close(NULL, &req, fd, NULL);
  uv_fs_req_cleanup(&req);

  unlink(mkstemp_req1.path);
  unlink(mkstemp_req2.path);
  uv_fs_req_cleanup(&mkstemp_req1);
  uv_fs_req_cleanup(&mkstemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}